

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  local_38.View_._M_str = (this->super_cmExportFileGenerator).FileBase._M_dataplus._M_p;
  local_38.View_._M_len = (this->super_cmExportFileGenerator).FileBase._M_string_length;
  local_68.View_._M_len = 2;
  local_68.View_._M_str = "-*";
  cmStrCat<std::__cxx11::string>
            (__return_storage_ptr__,&local_38,&local_68,&(this->super_cmExportFileGenerator).FileExt
            );
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetConfigImportFileGlob()
{
  std::string glob = cmStrCat(this->FileBase, "-*", this->FileExt);
  return glob;
}